

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O1

bool binlog::operator==(ClockSync *a,ClockSync *b)

{
  size_t __n;
  int iVar1;
  
  if ((((a->clockValue == b->clockValue) && (a->clockFrequency == b->clockFrequency)) &&
      (a->nsSinceEpoch == b->nsSinceEpoch)) &&
     ((a->tzOffset == b->tzOffset &&
      (__n = (a->tzName)._M_string_length, __n == (b->tzName)._M_string_length)))) {
    if (__n != 0) {
      iVar1 = bcmp((a->tzName)._M_dataplus._M_p,(b->tzName)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const ClockSync& a, const ClockSync& b)
{
  return a.clockValue == b.clockValue
    &&   a.clockFrequency == b.clockFrequency
    &&   a.nsSinceEpoch == b.nsSinceEpoch
    &&   a.tzOffset == b.tzOffset
    &&   a.tzName == b.tzName;
}